

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BS_thread_pool.hpp
# Opt level: O1

void __thiscall BS::thread_pool::create_threads(thread_pool *this)

{
  thread *ptVar1;
  long lVar2;
  thread_pool *local_50;
  thread local_48;
  code *local_40;
  undefined8 local_38;
  
  LOCK();
  (this->running)._M_base._M_i = true;
  UNLOCK();
  if (this->thread_count != 0) {
    lVar2 = 0;
    do {
      local_40 = worker;
      local_38 = 0;
      local_50 = this;
      std::thread::thread<void(BS::thread_pool::*)(),BS::thread_pool*,void>
                (&local_48,(offset_in_thread_pool_to_subr *)&local_40,&local_50);
      ptVar1 = (this->threads)._M_t.
               super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread[]>_>._M_t.
               super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread[]>_>.
               super__Head_base<0UL,_std::thread_*,_false>._M_head_impl;
      if (ptVar1[lVar2]._M_id._M_thread != 0) {
        std::terminate();
      }
      ptVar1[lVar2]._M_id._M_thread = (native_handle_type)local_48._M_id._M_thread;
      lVar2 = lVar2 + 1;
    } while ((uint)lVar2 < this->thread_count);
  }
  return;
}

Assistant:

void create_threads()
    {
        running = true;
        for (concurrency_t i = 0; i < thread_count; ++i)
        {
            threads[i] = std::thread(&thread_pool::worker, this);
        }
    }